

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::utp_stream::
async_write_some<boost::asio::const_buffer,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>>
          (utp_stream *this,const_buffer *buffers,
          write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_>
          *handler)

{
  bool bVar1;
  io_context *local_c8;
  undefined4 local_bc;
  _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_>_(boost::system::error_code,_unsigned_long)>
  local_b8;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    local_c8 = this->m_io_service;
    local_b8._M_f.stream_ = handler->stream_;
    local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_;
    local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_;
    local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.total_consumed_
         = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
    local_b8._M_f.start_ = handler->start_;
    local_b8._M_f.handler_.next_layer_ = (handler->handler_).next_layer_;
    local_b8._M_f.handler_.core_ = (handler->handler_).core_;
    local_b8._M_f.handler_.start_ = (handler->handler_).start_;
    local_b8._M_f.handler_.want_ = (handler->handler_).want_;
    local_b8._M_f.handler_.ec_.val_ = (handler->handler_).ec_.val_;
    local_b8._M_f.handler_.ec_.failed_ = (handler->handler_).ec_.failed_;
    local_b8._M_f.handler_.ec_._5_3_ = *(undefined3 *)&(handler->handler_).ec_.field_0x5;
    local_b8._M_f.handler_.ec_.cat_ = (handler->handler_).ec_.cat_;
    local_b8._M_f.handler_.bytes_transferred_ = (handler->handler_).bytes_transferred_;
    local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8._M_f.handler_.handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (handler->handler_).handler_.t.
              super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_b8._M_f.handler_.handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (handler->handler_).handler_.t.
         super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (handler->handler_).handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (handler->handler_).handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_b8._M_f.handler_.handler_.sock = (handler->handler_).handler_.sock;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x6b;
    local_bc = 1;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>(boost::asio::error::basic_errors,unsigned_long)>>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_c8,
               (_Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                *)&local_b8);
  }
  else if ((this->m_write_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
    bVar1 = check_fin_sent(this);
    if (bVar1) {
      local_c8 = this->m_io_service;
      local_b8._M_f.stream_ = handler->stream_;
      local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             data_;
      local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             size_;
      local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.
      total_consumed_ =
           (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
      local_b8._M_f.start_ = handler->start_;
      local_b8._M_f.handler_.next_layer_ = (handler->handler_).next_layer_;
      local_b8._M_f.handler_.core_ = (handler->handler_).core_;
      local_b8._M_f.handler_.start_ = (handler->handler_).start_;
      local_b8._M_f.handler_.want_ = (handler->handler_).want_;
      local_b8._M_f.handler_.ec_.val_ = (handler->handler_).ec_.val_;
      local_b8._M_f.handler_.ec_.failed_ = (handler->handler_).ec_.failed_;
      local_b8._M_f.handler_.ec_._5_3_ = *(undefined3 *)&(handler->handler_).ec_.field_0x5;
      local_b8._M_f.handler_.ec_.cat_ = (handler->handler_).ec_.cat_;
      local_b8._M_f.handler_.bytes_transferred_ = (handler->handler_).bytes_transferred_;
      local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_b8._M_f.handler_.handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (handler->handler_).handler_.t.
                super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_b8._M_f.handler_.handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (handler->handler_).handler_.t.
           super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      (handler->handler_).handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->handler_).handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b8._M_f.handler_.handler_.sock = (handler->handler_).handler_.sock;
      local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)0;
      local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x20;
      local_bc = 1;
      boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
      execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>(boost::asio::error::basic_errors,unsigned_long)>>
                ((basic_executor_type<std::allocator<void>,0u> *)&local_c8,
                 (_Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                  *)&local_b8);
    }
    else {
      if (buffers->size_ != 0) {
        add_write_buffer(this,buffers->data_,(int)buffers->size_);
        if (buffers->size_ != 0) {
          ::std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                    ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                     &this->m_write_handler,handler);
          issue_write(this);
          return;
        }
      }
      local_c8 = this->m_io_service;
      local_b8._M_f.stream_ = handler->stream_;
      local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             data_;
      local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             size_;
      local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.
      total_consumed_ =
           (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
      local_b8._M_f.start_ = handler->start_;
      local_b8._M_f.handler_.next_layer_ = (handler->handler_).next_layer_;
      local_b8._M_f.handler_.core_ = (handler->handler_).core_;
      local_b8._M_f.handler_.start_ = (handler->handler_).start_;
      local_b8._M_f.handler_.want_ = (handler->handler_).want_;
      local_b8._M_f.handler_.ec_.val_ = (handler->handler_).ec_.val_;
      local_b8._M_f.handler_.ec_.failed_ = (handler->handler_).ec_.failed_;
      local_b8._M_f.handler_.ec_._5_3_ = *(undefined3 *)&(handler->handler_).ec_.field_0x5;
      local_b8._M_f.handler_.ec_.cat_ = (handler->handler_).ec_.cat_;
      local_b8._M_f.handler_.bytes_transferred_ = (handler->handler_).bytes_transferred_;
      local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_b8._M_f.handler_.handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (handler->handler_).handler_.t.
                super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_b8._M_f.handler_.handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (handler->handler_).handler_.t.
           super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      (handler->handler_).handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->handler_).handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b8._M_f.handler_.handler_.sock = (handler->handler_).handler_.sock;
      local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)0;
      local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0;
      local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.failed_ = false;
      local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      local_bc = 1;
      boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
      execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>(boost::system::error_code,unsigned_long)>>
                ((basic_executor_type<std::allocator<void>,0u> *)&local_c8,&local_b8);
    }
  }
  else {
    local_c8 = this->m_io_service;
    local_b8._M_f.stream_ = handler->stream_;
    local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_;
    local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_;
    local_b8._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.total_consumed_
         = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
    local_b8._M_f.start_ = handler->start_;
    local_b8._M_f.handler_.next_layer_ = (handler->handler_).next_layer_;
    local_b8._M_f.handler_.core_ = (handler->handler_).core_;
    local_b8._M_f.handler_.start_ = (handler->handler_).start_;
    local_b8._M_f.handler_.want_ = (handler->handler_).want_;
    local_b8._M_f.handler_.ec_.val_ = (handler->handler_).ec_.val_;
    local_b8._M_f.handler_.ec_.failed_ = (handler->handler_).ec_.failed_;
    local_b8._M_f.handler_.ec_._5_3_ = *(undefined3 *)&(handler->handler_).ec_.field_0x5;
    local_b8._M_f.handler_.ec_.cat_ = (handler->handler_).ec_.cat_;
    local_b8._M_f.handler_.bytes_transferred_ = (handler->handler_).bytes_transferred_;
    local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (handler->handler_).handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8._M_f.handler_.handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (handler->handler_).handler_.t.
              super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_b8._M_f.handler_.handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (handler->handler_).handler_.t.
         super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (handler->handler_).handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (handler->handler_).handler_.t.
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_b8._M_f.handler_.handler_.sock = (handler->handler_).handler_.sock;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x5f;
    local_bc = 1;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>(boost::asio::error::basic_errors,unsigned_long)>>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_c8,
               (_Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                *)&local_b8);
  }
  if (local_b8._M_f.handler_.handler_.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8._M_f.handler_.handler_.t.
               super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8._M_f.handler_.handler_.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8._M_f.handler_.handler_.h.
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler handler)
	{
		if (m_impl == nullptr)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::broken_pipe, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			bytes_added += i->size();
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			post(m_io_service, std::bind<void>(std::move(handler), error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = std::move(handler);
		issue_write();
	}